

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O0

void __thiscall NPC::Attack(NPC *this,Character *target)

{
  World *pWVar1;
  Character *pCVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  int *piVar8;
  list<Character_*,_std::allocator<Character_*>_> *this_00;
  reference ppCVar9;
  int iVar10;
  int iVar11;
  double extraout_XMM0_Qa;
  double dVar12;
  bool local_2e1;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  int local_280;
  int local_27c;
  undefined1 local_278 [8];
  PacketBuilder builder;
  int ydiff;
  int xdiff;
  int local_218;
  int local_214;
  int local_210;
  int limitamount;
  string local_208;
  double local_1e8;
  double hit_rate;
  string local_1d8;
  allocator<char> local_1b1;
  key_type local_1b0;
  allocator<char> local_189;
  key_type local_188;
  allocator<char> local_161;
  key_type local_160;
  allocator<char> local_139;
  key_type local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  formula_vars;
  key_type local_88;
  byte local_61;
  double dStack_60;
  bool critical;
  double rand;
  allocator<char> local_41;
  key_type local_40;
  int local_1c;
  Character *pCStack_18;
  int amount;
  Character *target_local;
  NPC *this_local;
  
  pCStack_18 = target;
  target_local = (Character *)this;
  ENF(this);
  ENF(this);
  pWVar1 = this->map->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"NPCAdjustMaxDam",&local_41);
  pmVar6 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_40);
  util::variant::operator_cast_to_int(pmVar6);
  iVar5 = util::rand();
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_1c = iVar5;
  util::rand();
  iVar5 = (uint)pCStack_18->direction - (uint)this->direction;
  if (iVar5 < 1) {
    iVar5 = -iVar5;
  }
  formula_vars._M_h._M_single_bucket._6_1_ = 0;
  formula_vars._M_h._M_single_bucket._5_1_ = 0;
  local_2e1 = true;
  dStack_60 = extraout_XMM0_Qa;
  if (iVar5 == 2) {
    pWVar1 = this->map->world;
    std::allocator<char>::allocator();
    formula_vars._M_h._M_single_bucket._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"CriticalRate",
               (allocator<char> *)((long)&formula_vars._M_h._M_single_bucket + 7));
    formula_vars._M_h._M_single_bucket._5_1_ = 1;
    pmVar6 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar1->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_88);
    dVar12 = util::variant::operator_cast_to_double(pmVar6);
    local_2e1 = extraout_XMM0_Qa < dVar12;
  }
  if ((formula_vars._M_h._M_single_bucket._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  if ((formula_vars._M_h._M_single_bucket._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&formula_vars._M_h._M_single_bucket + 7));
  }
  local_61 = local_2e1;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   *)local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9);
  FormulaVars(this,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  pCVar2 = pCStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"target_",&local_111);
  Character::FormulaVars
            (pCVar2,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     *)local_c8,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  pWVar1 = this->map->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"MobRate",&local_139);
  pmVar6 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_138);
  dVar12 = util::variant::operator_cast_to_double(pmVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"modifier",&local_161);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                         *)local_c8,&local_160);
  *pmVar7 = 1.0 / dVar12;
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  dVar12 = (double)local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"damage",&local_189);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                         *)local_c8,&local_188);
  *pmVar7 = dVar12;
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  bVar3 = local_61 & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"critical",&local_1b1);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                         *)local_c8,&local_1b0);
  *pmVar7 = (double)bVar3;
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  pWVar1 = this->map->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"damage",(allocator<char> *)((long)&hit_rate + 7));
  dVar12 = World::EvalFormula(pWVar1,&local_1d8,
                              (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                               *)local_c8);
  local_1c = (int)dVar12;
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&hit_rate + 7));
  pWVar1 = this->map->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"hit_rate",(allocator<char> *)((long)&limitamount + 3));
  dVar12 = World::EvalFormula(pWVar1,&local_208,
                              (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                               *)local_c8);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)((long)&limitamount + 3));
  if (dVar12 < dStack_60) {
    local_1c = 0;
  }
  local_210 = 0;
  local_1e8 = dVar12;
  piVar8 = std::max<int>(&local_1c,&local_210);
  local_1c = *piVar8;
  local_218 = pCStack_18->hp;
  piVar8 = std::min<int>(&local_1c,&local_218);
  local_214 = *piVar8;
  pWVar1 = this->map->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&xdiff,"LimitDamage",(allocator<char> *)((long)&ydiff + 3));
  pmVar6 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,(key_type *)&xdiff);
  bVar4 = util::variant::operator_cast_to_bool(pmVar6);
  std::__cxx11::string::~string((string *)&xdiff);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ydiff + 3));
  if (bVar4) {
    local_1c = local_214;
  }
  pCStack_18->hp = pCStack_18->hp - local_214;
  if (pCStack_18->party != (Party *)0x0) {
    Party::UpdateHP(pCStack_18->party,pCStack_18);
  }
  iVar10 = (uint)this->x - (uint)pCStack_18->x;
  builder.add_size._4_4_ = (uint)this->y - (uint)pCStack_18->y;
  iVar5 = iVar10;
  if (iVar10 < 1) {
    iVar5 = -iVar10;
  }
  iVar11 = builder.add_size._4_4_;
  if (builder.add_size._4_4_ < 1) {
    iVar11 = -builder.add_size._4_4_;
  }
  if (iVar11 < iVar5) {
    if (iVar10 < 0) {
      this->direction = DIRECTION_RIGHT;
    }
    else {
      this->direction = DIRECTION_LEFT;
    }
  }
  else if (builder.add_size._4_4_ < 0) {
    this->direction = DIRECTION_DOWN;
  }
  else {
    this->direction = DIRECTION_UP;
  }
  PacketBuilder::PacketBuilder((PacketBuilder *)local_278,PACKET_NPC,PACKET_PLAYER,0x12);
  PacketBuilder::AddByte((PacketBuilder *)local_278,0xff);
  PacketBuilder::AddChar((PacketBuilder *)local_278,(uint)this->index);
  PacketBuilder::AddChar((PacketBuilder *)local_278,(pCStack_18->hp == 0) + 1);
  PacketBuilder::AddChar((PacketBuilder *)local_278,(uint)this->direction);
  iVar5 = Character::PlayerID(pCStack_18);
  PacketBuilder::AddShort((PacketBuilder *)local_278,iVar5);
  PacketBuilder::AddThree((PacketBuilder *)local_278,local_1c);
  local_27c = (int)(((double)pCStack_18->hp / (double)pCStack_18->maxhp) * 100.0);
  local_280 = 0;
  __range1._4_4_ = 100;
  iVar5 = util::clamp<int>(&local_27c,&local_280,(int *)((long)&__range1 + 4));
  PacketBuilder::AddThree((PacketBuilder *)local_278,iVar5);
  PacketBuilder::AddByte((PacketBuilder *)local_278,0xff);
  PacketBuilder::AddByte((PacketBuilder *)local_278,0xff);
  this_00 = &this->map->characters;
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(this_00);
  character = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(this_00);
  while (bVar4 = std::operator!=(&__end1,(_Self *)&character), bVar4) {
    ppCVar9 = std::_List_iterator<Character_*>::operator*(&__end1);
    pCVar2 = *ppCVar9;
    if ((pCVar2 != pCStack_18) && (bVar4 = Character::InRange(pCVar2,pCStack_18), bVar4)) {
      Character::Send(pCVar2,(PacketBuilder *)local_278);
    }
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  if (pCStack_18->hp == 0) {
    Character::DeathRespawn(pCStack_18);
  }
  PacketBuilder::AddShort((PacketBuilder *)local_278,pCStack_18->hp);
  PacketBuilder::AddShort((PacketBuilder *)local_278,pCStack_18->tp);
  Character::Send(pCStack_18,(PacketBuilder *)local_278);
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_278);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)local_c8);
  return;
}

Assistant:

void NPC::Attack(Character *target)
{
	int amount = util::rand(this->ENF().mindam, this->ENF().maxdam + static_cast<int>(this->map->world->config["NPCAdjustMaxDam"]));
	double rand = util::rand(0.0, 1.0);
	// Checks if target is facing you
	bool critical = std::abs(int(target->direction) - this->direction) != 2 || rand < static_cast<double>(this->map->world->config["CriticalRate"]);

	std::unordered_map<std::string, double> formula_vars;

	this->FormulaVars(formula_vars);
	target->FormulaVars(formula_vars, "target_");
	formula_vars["modifier"] = 1.0 / static_cast<double>(this->map->world->config["MobRate"]);
	formula_vars["damage"] = amount;
	formula_vars["critical"] = critical;

	amount = this->map->world->EvalFormula("damage", formula_vars);
	double hit_rate = this->map->world->EvalFormula("hit_rate", formula_vars);

	if (rand > hit_rate)
	{
		amount = 0;
	}

	amount = std::max(amount, 0);

	int limitamount = std::min(amount, int(target->hp));

	if (this->map->world->config["LimitDamage"])
	{
		amount = limitamount;
	}

	target->hp -= limitamount;
	if (target->party)
	{
		target->party->UpdateHP(target);
	}

	int xdiff = this->x - target->x;
	int ydiff = this->y - target->y;

	if (std::abs(xdiff) > std::abs(ydiff))
	{
		if (xdiff < 0)
		{
			this->direction = DIRECTION_RIGHT;
		}
		else
		{
			this->direction = DIRECTION_LEFT;
		}
	}
	else
	{
		if (ydiff < 0)
		{
			this->direction = DIRECTION_DOWN;
		}
		else
		{
			this->direction = DIRECTION_UP;
		}
	}

	PacketBuilder builder(PACKET_NPC, PACKET_PLAYER, 18);
	builder.AddByte(255);
	builder.AddChar(this->index);
	builder.AddChar(1 + (target->hp == 0));
	builder.AddChar(this->direction);
	builder.AddShort(target->PlayerID());
	builder.AddThree(amount);
	builder.AddThree(util::clamp<int>(double(target->hp) / double(target->maxhp) * 100.0, 0, 100));
	builder.AddByte(255);
	builder.AddByte(255);

	UTIL_FOREACH(this->map->characters, character)
	{
		if (character == target || !character->InRange(target))
		{
			continue;
		}

		character->Send(builder);
	}

	if (target->hp == 0)
	{
		target->DeathRespawn();
	}

	builder.AddShort(target->hp);
	builder.AddShort(target->tp);

	target->Send(builder);
}